

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O0

char * blogc_format_date(char *date,bc_trie_t *global,bc_trie_t *local)

{
  char *rv;
  bc_error_t *err;
  char *date_format;
  bc_trie_t *local_local;
  bc_trie_t *global_local;
  char *date_local;
  
  date_format = (char *)local;
  local_local = global;
  global_local = (bc_trie_t *)date;
  err = (bc_error_t *)blogc_get_variable("DATE_FORMAT",global,local);
  if (global_local == (bc_trie_t *)0x0) {
    date_local = (char *)0x0;
  }
  else if (err == (bc_error_t *)0x0) {
    date_local = bc_strdup((char *)global_local);
  }
  else {
    rv = (char *)0x0;
    date_local = blogc_convert_datetime((char *)global_local,(char *)err,(bc_error_t **)&rv);
    if (rv != (char *)0x0) {
      bc_error_print((bc_error_t *)rv,"blogc");
      bc_error_free((bc_error_t *)rv);
      date_local = bc_strdup((char *)global_local);
    }
  }
  return date_local;
}

Assistant:

char*
blogc_format_date(const char *date, bc_trie_t *global, bc_trie_t *local)
{
    const char *date_format = blogc_get_variable("DATE_FORMAT", global, local);
    if (date == NULL)
        return NULL;
    if (date_format == NULL)
        return bc_strdup(date);

    bc_error_t *err = NULL;
    char *rv = blogc_convert_datetime(date, date_format, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        bc_error_free(err);
        return bc_strdup(date);
    }
    return rv;
}